

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeChakraLibraryObject
               (DynamicObject *chakraLibraryObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  RuntimeFunction *pRVar1;
  
  this = (((chakraLibraryObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  DeferredTypeHandlerBase::Convert(typeHandler,chakraLibraryObject,mode,8,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)
                           JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
                           JsBuiltIn_Internal_ToLengthFunction,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x280);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x280,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)
                           JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
                           JsBuiltIn_Internal_ToIntegerFunction,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x281);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x281,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)
                           JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
                           JsBuiltIn_Internal_GetLength,1,(DynamicObject *)0x0,(DynamicType *)0x0,
                      0x27c);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x27c,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)
                           JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
                           JsBuiltIn_Internal_InitInternalProperties,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x27d);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x27d,pRVar1,6,0,0,0);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0xbe,(this->isArrayFunction).ptr,6,0,0,0);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x111,(this->super_JavascriptLibraryBase).objectConstructor.ptr,6,0
             ,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)
                           JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
                           JsBuiltIn_Internal_ArraySpeciesCreate,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x282);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x282,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)
                           JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
                           JsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x283);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x283,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)EngineInterfaceObject::EntryInfo::CallInstanceFunction,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x28b);
  (*(chakraLibraryObject->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (chakraLibraryObject,0x28b,pRVar1,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x840);
  *(RuntimeFunction **)&this->field_0x840 = pRVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x840);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeChakraLibraryObject(DynamicObject * chakraLibraryObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = chakraLibraryObject->GetLibrary();
        typeHandler->Convert(chakraLibraryObject, mode, 8);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();
        JavascriptFunction * func = nullptr;

        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::toLength, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ToLengthFunction, 1);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::toInteger, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ToIntegerFunction, 1);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::GetLength, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_GetLength, 1);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::InitInternalProperties, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_InitInternalProperties, 1);
        library->AddMember(chakraLibraryObject, PropertyIds::isArray, library->isArrayFunction);
        library->AddMember(chakraLibraryObject, PropertyIds::Object, library->objectConstructor);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::arraySpeciesCreate, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ArraySpeciesCreate, 2);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::arrayCreateDataPropertyOrThrow, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow, 3);
        func = library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::builtInCallInstanceFunction, &EngineInterfaceObject::EntryInfo::CallInstanceFunction, 1);
        builtinFuncs[BuiltinFunction::EngineInterfaceObject_CallInstanceFunction] = func;

        return true;
    }